

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::ConvertToOutputForExisting
          (string *__return_storage_ptr__,cmOutputConverter *this,string *remote,OutputFormat format
          )

{
  bool bVar1;
  cmState *this_00;
  long lVar2;
  string tmp;
  string local_50;
  
  this_00 = cmStateSnapshot::GetState(&this->StateSnapshot);
  bVar1 = cmState::UseWindowsShell(this_00);
  if (((bVar1) && (lVar2 = std::__cxx11::string::find((char)remote,0x20), lVar2 != -1)) &&
     (bVar1 = cmsys::SystemTools::FileExists(remote), bVar1)) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar1 = cmsys::SystemTools::GetShortPath(remote,&local_50);
    if (bVar1) {
      ConvertToOutputFormat(__return_storage_ptr__,this,&local_50,format);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  ConvertToOutputFormat(__return_storage_ptr__,this,remote,format);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputForExisting(
  const std::string& remote, OutputFormat format) const
{
  // If this is a windows shell, the result has a space, and the path
  // already exists, we can use a short-path to reference it without a
  // space.
  if (this->GetState()->UseWindowsShell() &&
      remote.find(' ') != std::string::npos &&
      cmSystemTools::FileExists(remote)) {
    std::string tmp;
    if (cmSystemTools::GetShortPath(remote, tmp)) {
      return this->ConvertToOutputFormat(tmp, format);
    }
  }

  // Otherwise, perform standard conversion.
  return this->ConvertToOutputFormat(remote, format);
}